

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalNinjaGenerator.cxx
# Opt level: O2

string * __thiscall
cmGlobalNinjaGenerator::ninjaCmd_abi_cxx11_
          (string *__return_storage_ptr__,cmGlobalNinjaGenerator *this)

{
  cmLocalGenerator *pcVar1;
  cmMakefile *this_00;
  char *pcVar2;
  allocator local_62;
  allocator local_61;
  string local_60;
  string local_40;
  
  pcVar1 = *(this->super_cmGlobalGenerator).LocalGenerators.
            super__Vector_base<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  if (pcVar1 == (cmLocalGenerator *)0x0) {
    std::__cxx11::string::string((string *)__return_storage_ptr__,"ninja",(allocator *)&local_60);
  }
  else {
    this_00 = pcVar1->Makefile;
    std::__cxx11::string::string((string *)&local_40,"CMAKE_MAKE_PROGRAM",&local_61);
    pcVar2 = cmMakefile::GetRequiredDefinition(this_00,&local_40);
    std::__cxx11::string::string((string *)&local_60,pcVar2,&local_62);
    cmOutputConverter::ConvertToOutputFormat
              (__return_storage_ptr__,&pcVar1->super_cmOutputConverter,&local_60,SHELL);
    std::__cxx11::string::~string((string *)&local_60);
    std::__cxx11::string::~string((string *)&local_40);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string cmGlobalNinjaGenerator::ninjaCmd() const
{
  cmLocalGenerator* lgen = this->LocalGenerators[0];
  if (lgen) {
    return lgen->ConvertToOutputFormat(
             lgen->GetMakefile()->GetRequiredDefinition("CMAKE_MAKE_PROGRAM"),
                                    cmLocalGenerator::SHELL);
  }
  return "ninja";
}